

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

char * search_5_3::index(char *__s,int __c)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  
  iVar1 = next((char *)CONCAT44(in_register_00000034,__c),(int *)CONCAT44(in_register_00000034,__c))
  ;
  return (char *)CONCAT44(extraout_var,iVar1);
}

Assistant:

int index(char *s, char *t, int p = 0) {
        int i = p, j = 1;
        int *a;
        next(t, a);
        while (i < s[0] && j < t[0]) {
            if (s[i] == t[j]) {
                i++, j++;
            } else {
                j = a[j];
            }
        }
        if (j > t[0])
            return i - t[0];
        return 0;
    }